

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib555.c
# Opt level: O0

size_t readcallback(void *ptr,size_t size,size_t nmemb,void *clientp)

{
  int *counter;
  void *clientp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (*clientp == 0) {
    *(int *)clientp = *clientp + 1;
    if (size * nmemb < 0x25) {
      curl_mfprintf(_stderr,"READ NOT FINE!\n");
      ptr_local = (void *)0x0;
    }
    else {
      curl_mfprintf(_stderr,"READ!\n");
      strcpy((char *)ptr,"this is the blurb we want to upload\n");
      ptr_local = (void *)0x24;
    }
  }
  else {
    curl_mfprintf(_stderr,"READ ALREADY DONE!\n");
    ptr_local = (void *)0x0;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t readcallback(void  *ptr,
                           size_t size,
                           size_t nmemb,
                           void *clientp)
{
  int *counter = (int *)clientp;

  if(*counter) {
    /* only do this once and then require a clearing of this */
    fprintf(stderr, "READ ALREADY DONE!\n");
    return 0;
  }
  (*counter)++; /* bump */

  if(size * nmemb > strlen(uploadthis)) {
    fprintf(stderr, "READ!\n");
    strcpy(ptr, uploadthis);
    return strlen(uploadthis);
  }
  fprintf(stderr, "READ NOT FINE!\n");
  return 0;
}